

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

void __thiscall Timidity::Renderer::kill_key_group(Renderer *this,int i)

{
  Voice *pVVar1;
  int i_00;
  long lVar2;
  long lVar3;
  bool bVar5;
  long lVar4;
  
  if ((this->voice[i].sample)->key_group != 0) {
    i_00 = this->voices;
    lVar2 = (long)i_00;
    lVar3 = lVar2 * 0x170;
    while( true ) {
      lVar4 = lVar3;
      i_00 = i_00 + -1;
      lVar3 = lVar4 + -0x170;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + -1;
      if (bVar5) break;
      pVVar1 = this->voice;
      if (((i != i_00 && ((&pVVar1[-1].status)[lVar4] & 0xd) != 1) &&
          (pVVar1[i].channel == (&pVVar1[-1].channel)[lVar4])) &&
         (*(WORD *)(*(long *)((long)&pVVar1[-1].sample + lVar4) + 0x4c) ==
          (pVVar1[i].sample)->key_group)) {
        kill_note(this,i_00);
      }
    }
  }
  return;
}

Assistant:

void Renderer::kill_key_group(int i)
{
	int j = voices; 

	if (voice[i].sample->key_group == 0)
	{
		return;
	}
	while (j--)
	{
		if ((voice[j].status & VOICE_RUNNING) && !(voice[j].status & (VOICE_RELEASING | VOICE_STOPPING))) continue;
		if (i == j) continue;
		if (voice[i].channel != voice[j].channel) continue;
		if (voice[j].sample->key_group != voice[i].sample->key_group) continue;
		kill_note(j);
	}
}